

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O0

void __thiscall ROM::Request::Node::sort(Node *this)

{
  reference pvVar1;
  iterator __last;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_48;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_40;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_38;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_30;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_28;
  byte local_19;
  size_type sStack_18;
  bool has_seen_non_optional;
  ssize_t index;
  Node *this_local;
  
  index = (ssize_t)this;
  sStack_18 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::size
                        (&this->children);
  local_19 = 0;
  while (sStack_18 = sStack_18 - 1, -1 < (long)sStack_18) {
    pvVar1 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::operator[]
                       (&this->children,sStack_18);
    local_19 = (local_19 & 1) != 0 || ((pvVar1->is_optional ^ 0xffU) & 1) != 0;
    pvVar1 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::operator[]
                       (&this->children,sStack_18);
    if (((pvVar1->is_optional & 1U) != 0) && ((local_19 & 1) != 0)) {
      local_30._M_current =
           (Node *)std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::begin
                             (&this->children);
      local_28 = __gnu_cxx::
                 __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                 ::operator+(&local_30,sStack_18);
      local_48._M_current =
           (Node *)std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::begin
                             (&this->children);
      local_40 = __gnu_cxx::
                 __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                 ::operator+(&local_48,sStack_18);
      local_38 = __gnu_cxx::
                 __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                 ::operator+(&local_40,1);
      __last = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::end
                         (&this->children);
      std::_V2::
      rotate<__gnu_cxx::__normal_iterator<ROM::Request::Node*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>>
                (local_28,local_38,
                 (__normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                  )__last._M_current);
    }
  }
  return;
}

Assistant:

void sort() {
				// Don't do a full sort, but move anything optional to the back.
				// This makes them print more nicely; it's a human-facing tweak only.
				ssize_t index = ssize_t(children.size() - 1);
				bool has_seen_non_optional = false;
				while(index >= 0) {
					has_seen_non_optional |= !children[size_t(index)].is_optional;
					if(children[size_t(index)].is_optional && has_seen_non_optional) {
						std::rotate(children.begin() + index, children.begin() + index + 1, children.end());
					}
					--index;
				}
			}